

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_add(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint bw;
  uint64_t uVar1;
  uint64_t uVar2;
  BtorSimBitVector *bv;
  ulong uVar3;
  ulong uVar4;
  
  bw = a->width;
  if (bw < 0x41) {
    uVar1 = btorsim_bv_to_uint64(a);
    uVar2 = btorsim_bv_to_uint64(b);
    bv = btorsim_bv_uint64_to_bv(uVar1 + uVar2,bw);
  }
  else {
    bv = btorsim_bv_new(bw);
    uVar4 = 0;
    for (uVar3 = (ulong)(a->len - 1); -1 < (long)uVar3; uVar3 = uVar3 - 1) {
      uVar4 = (ulong)(&b[1].width)[uVar3] + uVar4 + (&a[1].width)[uVar3];
      (&bv[1].width)[uVar3] = (uint32_t)uVar4;
      uVar4 = uVar4 >> 0x20;
    }
  }
  set_rem_bits_to_zero(bv);
  return bv;
}

Assistant:

BtorSimBitVector *
btorsim_bv_add (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  int64_t i;
  uint64_t x, y, sum;
  BtorSimBitVector *res;
  BTORSIM_BV_TYPE carry;

  if (a->width <= 64)
  {
    x   = btorsim_bv_to_uint64 (a);
    y   = btorsim_bv_to_uint64 (b);
    res = btorsim_bv_uint64_to_bv (x + y, a->width);
  }
  else
  {
    res   = btorsim_bv_new (a->width);
    carry = 0;
    for (i = a->len - 1; i >= 0; i--)
    {
      sum          = (uint64_t) a->bits[i] + b->bits[i] + carry;
      res->bits[i] = (BTORSIM_BV_TYPE) sum;
      carry        = (BTORSIM_BV_TYPE) (sum >> 32);
    }
  }

  set_rem_bits_to_zero (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}